

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

bool __thiscall
trun::Process_Unix::SpawnAndLoop
          (Process_Unix *this,string *command,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments,ProcessCallbackBase *callback)

{
  _func_int *p_Var1;
  long lVar2;
  Log *this_00;
  allocator<char> *paVar3;
  pid_t *__pid;
  Process_Unix *pPVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  bool bVar6;
  int iVar7;
  size_type sVar8;
  char **__argv;
  char *pcVar9;
  pointer this_01;
  ILogger *pIVar10;
  posix_spawn_file_actions_t *ppVar11;
  int *piVar12;
  char *apcStack_150 [2];
  int local_13c;
  Log *local_138;
  allocator<char> *local_130;
  ILogger *local_128;
  allocator<char> *local_120;
  ILogger *local_118;
  allocator<char> *local_110;
  pid_t *local_108;
  Process_Unix *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_89;
  string local_88;
  int local_64;
  _Self _Stack_60;
  int status;
  _Self local_58;
  _Self local_50;
  iterator it;
  int i;
  char **param;
  int count;
  ProcessCallbackBase *callback_local;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  string *command_local;
  Process_Unix *this_local;
  
  apcStack_150[0] = (char *)0x25cc96;
  local_100 = this;
  local_f8 = command;
  sVar8 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(arguments);
  pbVar5 = local_f8;
  lVar2 = -((long)(int)sVar8 * 8 + 0x1fU & 0xfffffffffffffff0);
  __argv = (char **)((long)apcStack_150 + lVar2 + 8);
  it._M_node._4_4_ = 0;
  *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25ccc9;
  pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (pbVar5);
  __argv[it._M_node._4_4_] = pcVar9;
  it._M_node._4_4_ = it._M_node._4_4_ + 1;
  *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25ccea;
  local_50._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(arguments);
  while( true ) {
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25ccf7;
    local_58._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(arguments);
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cd08;
    bVar6 = std::operator==(&local_50,&local_58);
    pbVar5 = local_f8;
    if (((bVar6 ^ 0xffU) & 1) == 0) break;
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cd19;
    this_01 = std::
              _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator->(&local_50);
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cd21;
    pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (this_01);
    __argv[it._M_node._4_4_] = pcVar9;
    it._M_node._4_4_ = it._M_node._4_4_ + 1;
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cd44;
    _Stack_60 = std::
                _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&local_50,0);
  }
  __argv[it._M_node._4_4_] = (char *)0x0;
  local_108 = &local_100->pid;
  *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cd78;
  pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (pbVar5);
  __pid = local_108;
  ppVar11 = &local_100->child_fd_actions;
  *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cda4;
  local_64 = posix_spawnp(__pid,pcVar9,(posix_spawn_file_actions_t *)ppVar11,
                          (posix_spawnattr_t *)0x0,__argv,_environ);
  if (local_64 == 0) {
    local_110 = &local_89;
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cdc4;
    std::allocator<char>::allocator();
    paVar3 = local_110;
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cddb;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Process_Unix",paVar3);
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cde6;
    pIVar10 = gnilk::Logger::GetLogger(&local_88);
    local_118 = pIVar10;
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25ce02;
    gnilk::Log::Debug<char_const*>(pIVar10,"Spawn ok, entering monitoring loop");
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25ce0d;
    std::__cxx11::string::~string((string *)&local_88);
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25ce19;
    std::allocator<char>::~allocator(&local_89);
    p_Var1 = *(callback->super_ProcessCallbackInterface)._vptr_ProcessCallbackInterface;
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25ce22;
    (*p_Var1)();
    while( true ) {
      pPVar4 = local_100;
      *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25ce2e;
      bVar6 = IsFinished(pPVar4);
      pPVar4 = local_100;
      if (((bVar6 ^ 0xffU) & 1) == 0) break;
      *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25ce46;
      ConsumePipes(pPVar4,callback);
    }
    do {
      pPVar4 = local_100;
      *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25ce9a;
      iVar7 = ConsumePipes(pPVar4,callback);
    } while (0 < iVar7);
    local_120 = &local_c1;
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25ceb4;
    std::allocator<char>::allocator();
    paVar3 = local_120;
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cece;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Process_Unix",paVar3);
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cedc;
    pIVar10 = gnilk::Logger::GetLogger(&local_c0);
    local_128 = pIVar10;
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cef8;
    gnilk::Log::Debug<char_const*>(pIVar10,"Process loop finished");
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cf06;
    std::__cxx11::string::~string((string *)&local_c0);
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cf12;
    std::allocator<char>::~allocator(&local_c1);
    p_Var1 = (callback->super_ProcessCallbackInterface)._vptr_ProcessCallbackInterface[1];
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cf1c;
    (*p_Var1)();
    pPVar4 = local_100;
    piVar12 = local_100->pipe_stdout;
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cf2f;
    ClosePipe(pPVar4,piVar12);
    pPVar4 = local_100;
    piVar12 = local_100->pipe_stderr;
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cf42;
    ClosePipe(pPVar4,piVar12);
    ppVar11 = &local_100->child_fd_actions;
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25d068;
    posix_spawn_file_actions_destroy((posix_spawn_file_actions_t *)ppVar11);
    this_local._7_1_ = true;
  }
  else {
    local_130 = &local_e9;
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cf9d;
    std::allocator<char>::allocator();
    paVar3 = local_130;
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cfb7;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Process_Unix",paVar3);
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cfc5;
    local_138 = gnilk::Logger::GetLogger(&local_e8);
    iVar7 = local_64;
    local_13c = local_64;
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cfdc;
    pcVar9 = strerror(iVar7);
    this_00 = local_138;
    iVar7 = local_13c;
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25cff8;
    gnilk::Log::Error<char_const*,int,char*>(this_00,"spawn: %d, %s",iVar7,pcVar9);
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25d006;
    std::__cxx11::string::~string((string *)&local_e8);
    *(undefined8 *)((long)apcStack_150 + lVar2) = 0x25d012;
    std::allocator<char>::~allocator(&local_e9);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Process_Unix::SpawnAndLoop(std::string command, std::list<std::string> &arguments, ProcessCallbackBase *callback) {

	// construct param array
	int count = arguments.size();
	char **param = (char **)alloca(sizeof(char *) * (count + 2));
	int i = 0;
	// command is argv[0]
	param[i] = (char *)command.c_str();
	i++;
	for (auto it = arguments.begin(); it!=arguments.end(); it++) {
		param[i] = (char *)it->c_str();
		i++;
	}
	param[i] = NULL;

	int status = posix_spawnp(&pid, command.c_str(), &child_fd_actions, NULL, param, environ);
	if (status == 0) {
        gnilk::Logger::GetLogger("Process_Unix")->Debug("Spawn ok, entering monitoring loop");
		callback->OnProcessStarted();
		while (!IsFinished()) {
			ConsumePipes(callback);
		}			
		// Consume what ever is left after the process exited, perhaps this is enough...
		while(ConsumePipes(callback)>0) {}


        gnilk::Logger::GetLogger("Process_Unix")->Debug("Process loop finished");
		callback->OnProcessExit();

		ClosePipe(pipe_stdout);
		ClosePipe(pipe_stderr);
	} else {
        gnilk::Logger::GetLogger("Process_Unix")->Error("spawn: %d, %s", status, strerror(status));
		return false;
	}
	posix_spawn_file_actions_destroy(&child_fd_actions);
	return true;
}